

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintFileDescriptor(Generator *this)

{
  Printer *this_00;
  mapped_type *pmVar1;
  FileDescriptor *pFVar2;
  long lVar3;
  Syntax syntax;
  int i;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  byte bVar7;
  allocator local_e9;
  string module_alias;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  char file_descriptor_template [110];
  
  bVar7 = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string
            ((string *)file_descriptor_template,"descriptor_name",(allocator *)&module_alias);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)file_descriptor_template);
  std::__cxx11::string::assign((char *)pmVar1);
  std::__cxx11::string::~string((string *)file_descriptor_template);
  std::__cxx11::string::string((string *)file_descriptor_template,"name",(allocator *)&module_alias)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)file_descriptor_template);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::~string((string *)file_descriptor_template);
  std::__cxx11::string::string
            ((string *)file_descriptor_template,"package",(allocator *)&module_alias);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)file_descriptor_template);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::~string((string *)file_descriptor_template);
  (anonymous_namespace)::StringifySyntax_abi_cxx11_
            ((string *)file_descriptor_template,
             (_anonymous_namespace_ *)(ulong)*(uint *)(this->file_ + 0x8c),syntax);
  std::__cxx11::string::string((string *)&module_alias,"syntax",&local_e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&module_alias);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)file_descriptor_template);
  std::__cxx11::string::~string((string *)&module_alias);
  std::__cxx11::string::~string((string *)file_descriptor_template);
  pcVar5 = 
  "$descriptor_name$ = _descriptor.FileDescriptor(\n  name=\'$name$\',\n  package=\'$package$\',\n  syntax=\'$syntax$\',\n"
  ;
  pcVar6 = file_descriptor_template;
  for (lVar3 = 0x6e; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pcVar6 = *pcVar5;
    pcVar5 = pcVar5 + (ulong)bVar7 * -2 + 1;
    pcVar6 = pcVar6 + (ulong)bVar7 * -2 + 1;
  }
  io::Printer::Print(this->printer_,&m,file_descriptor_template);
  io::Printer::Indent(this->printer_);
  this_00 = this->printer_;
  strings::CHexEscape(&module_alias,&this->file_descriptor_serialized_);
  io::Printer::Print(this_00,"serialized_pb=_b(\'$value$\')\n","value",&module_alias);
  std::__cxx11::string::~string((string *)&module_alias);
  pFVar2 = this->file_;
  if (*(int *)(pFVar2 + 0x18) != 0) {
    io::Printer::Print(this->printer_,",\ndependencies=[");
    for (iVar4 = 0; iVar4 < *(int *)(this->file_ + 0x18); iVar4 = iVar4 + 1) {
      pFVar2 = FileDescriptor::dependency(this->file_,iVar4);
      anon_unknown_0::ModuleAlias(&module_alias,*(string **)pFVar2);
      io::Printer::Print(this->printer_,"$module_alias$.DESCRIPTOR,","module_alias",&module_alias);
      std::__cxx11::string::~string((string *)&module_alias);
    }
    io::Printer::Print(this->printer_,"]");
    pFVar2 = this->file_;
  }
  if (0 < *(int *)(pFVar2 + 0x38)) {
    io::Printer::Print(this->printer_,",\npublic_dependencies=[");
    for (iVar4 = 0; iVar4 < *(int *)(this->file_ + 0x38); iVar4 = iVar4 + 1) {
      pFVar2 = FileDescriptor::public_dependency(this->file_,iVar4);
      anon_unknown_0::ModuleAlias(&module_alias,*(string **)pFVar2);
      io::Printer::Print(this->printer_,"$module_alias$.DESCRIPTOR,","module_alias",&module_alias);
      std::__cxx11::string::~string((string *)&module_alias);
    }
    io::Printer::Print(this->printer_,"]");
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,")\n");
  io::Printer::Print(this->printer_,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  return;
}

Assistant:

void Generator::PrintFileDescriptor() const {
  std::map<string, string> m;
  m["descriptor_name"] = kDescriptorKey;
  m["name"] = file_->name();
  m["package"] = file_->package();
  m["syntax"] = StringifySyntax(file_->syntax());
  const char file_descriptor_template[] =
      "$descriptor_name$ = _descriptor.FileDescriptor(\n"
      "  name='$name$',\n"
      "  package='$package$',\n"
      "  syntax='$syntax$',\n";
  printer_->Print(m, file_descriptor_template);
  printer_->Indent();
  printer_->Print(
//##!PY25      "serialized_pb=b'$value$'\n",
      "serialized_pb=_b('$value$')\n",  //##PY25
      "value", strings::CHexEscape(file_descriptor_serialized_));
  if (file_->dependency_count() != 0) {
    printer_->Print(",\ndependencies=[");
    for (int i = 0; i < file_->dependency_count(); ++i) {
      string module_alias = ModuleAlias(file_->dependency(i)->name());
      printer_->Print("$module_alias$.DESCRIPTOR,", "module_alias",
                      module_alias);
    }
    printer_->Print("]");
  }
  if (file_->public_dependency_count() > 0) {
    printer_->Print(",\npublic_dependencies=[");
    for (int i = 0; i < file_->public_dependency_count(); ++i) {
      string module_alias = ModuleAlias(file_->public_dependency(i)->name());
      printer_->Print("$module_alias$.DESCRIPTOR,", "module_alias",
                      module_alias);
    }
    printer_->Print("]");
  }

  // TODO(falk): Also print options and fix the message_type, enum_type,
  //             service and extension later in the generation.

  printer_->Outdent();
  printer_->Print(")\n");
  printer_->Print("\n");
}